

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

unsigned_short __thiscall
pstore::serialize::archive::buffer_reader::get<unsigned_short>(buffer_reader *this)

{
  unsigned_short uVar1;
  type_conflict result;
  buffer_reader *this_local;
  
  if (this->last_ < this->first_ + 2) {
    raise<std::errc,char[44]>
              (no_buffer_space,(char (*) [44])"Attempted to read past the end of a buffer.");
  }
  uVar1 = *(unsigned_short *)this->first_;
  this->first_ = this->first_ + 2;
  return uVar1;
}

Assistant:

T get () {
                    typename std::remove_const<T>::type result;
                    static_assert (std::is_standard_layout<T>::value,
                                   "buffer_reader(T&) can only read standard-layout types");
                    if (first_ + sizeof (T) > last_) {
                        raise (std::errc::no_buffer_space,
                               "Attempted to read past the end of a buffer.");
                    }
                    std::memcpy (&result, first_, sizeof (T));
                    first_ += sizeof (T);
                    return result;
                }